

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *pZVar1;
  void *pvVar2;
  ZSTD_CDict *pZVar3;
  ZSTD_CDict *pZVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    sVar6 = 0;
  }
  else {
    pZVar1 = (ZSTD_CCtx *)(cctx->workspace).workspace;
    pvVar2 = (cctx->workspace).workspaceEnd;
    lVar8 = 0x488;
    if (pZVar1 == cctx) {
      lVar8 = 0;
    }
    sVar6 = (cctx->localDict).dictSize;
    pZVar3 = (cctx->localDict).cdict;
    lVar9 = 0;
    if (pZVar3 != (ZSTD_CDict *)0x0) {
      pZVar4 = (ZSTD_CDict *)(pZVar3->workspace).workspace;
      lVar7 = (long)(pZVar3->workspace).workspaceEnd - (long)pZVar4;
      lVar9 = lVar7 + 0x1340;
      if (pZVar4 == pZVar3) {
        lVar9 = lVar7;
      }
    }
    if ((cctx->localDict).dictBuffer == (void *)0x0) {
      sVar6 = 0;
    }
    sVar5 = ZSTDMT_sizeof_CCtx(cctx->mtctx);
    sVar6 = (long)pvVar2 + sVar5 + sVar6 + lVar9 + (lVar8 - (long)pZVar1);
  }
  return sVar6;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}